

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtoolbutton.cpp
# Opt level: O2

int __thiscall QToolButton::qt_metacall(QToolButton *this,Call _c,int _id,void **_a)

{
  uint _id_00;
  
  _id_00 = QAbstractButton::qt_metacall(&this->super_QAbstractButton,_c,_id,_a);
  if ((int)_id_00 < 0) {
    return _id_00;
  }
  if (BindableProperty < _c) {
    return _id_00;
  }
  if ((0x14eU >> (_c & 0x1f) & 1) == 0) {
    if (_c == InvokeMetaMethod) {
      if (3 < _id_00) goto LAB_00479122;
      _c = InvokeMetaMethod;
    }
    else {
      if (_c != RegisterMethodArgumentMetaType) {
        return _id_00;
      }
      if (3 < _id_00) goto LAB_00479122;
      _c = RegisterMethodArgumentMetaType;
    }
  }
  qt_static_metacall((QObject *)this,_c,_id_00,_a);
LAB_00479122:
  return _id_00 - 4;
}

Assistant:

int QToolButton::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QAbstractButton::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 4)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 4;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 4)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 4;
    }
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 4;
    }
    return _id;
}